

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O1

Aig_Man_t * Abc_NtkToDarChoices(Abc_Ntk_t *pNtk)

{
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar1;
  void *pvVar2;
  long lVar3;
  long *plVar4;
  int iVar5;
  Vec_Ptr_t *pVVar6;
  Aig_Man_t *p;
  char *pcVar7;
  Aig_Obj_t **__s;
  Abc_Obj_t *pAVar8;
  Vec_Ptr_t *pVVar9;
  Aig_Obj_t *pAVar10;
  long *plVar11;
  Aig_Man_t *pAVar12;
  size_t __size;
  long lVar13;
  long *plVar14;
  
  pVVar6 = Abc_AigDfs(pNtk,0,0);
  p = Aig_ManStart(pNtk->nObjCounts[7] + 100);
  p->nConstrs = pNtk->nConstrs;
  p->nBarBufs = pNtk->nBarBufs;
  pcVar7 = Extra_UtilStrsav(pNtk->pName);
  p->pName = pcVar7;
  pcVar7 = Extra_UtilStrsav(pNtk->pSpec);
  p->pSpec = pcVar7;
  iVar5 = Abc_NtkGetChoiceNum(pNtk);
  if (iVar5 != 0) {
    __size = (long)pNtk->nObjs << 3;
    __s = (Aig_Obj_t **)malloc(__size);
    p->pEquivs = __s;
    memset(__s,0,__size);
  }
  aVar1 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)p->pConst1;
  pAVar8 = Abc_AigConst1(pNtk);
  pAVar8->field_6 = aVar1;
  pVVar9 = pNtk->vCis;
  if (0 < pVVar9->nSize) {
    lVar13 = 0;
    do {
      pvVar2 = pVVar9->pArray[lVar13];
      pAVar10 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar2 + 0x40) = pAVar10;
      lVar13 = lVar13 + 1;
      pVVar9 = pNtk->vCis;
    } while (lVar13 < pVVar9->nSize);
  }
  if (0 < pVVar6->nSize) {
    lVar13 = 0;
    do {
      plVar14 = (long *)pVVar6->pArray[lVar13];
      lVar3 = *(long *)(*(long *)(*plVar14 + 0x20) + 8);
      pAVar10 = Aig_And(p,(Aig_Obj_t *)
                          ((ulong)(*(uint *)((long)plVar14 + 0x14) >> 10 & 1) ^
                          *(ulong *)(*(long *)(lVar3 + (long)*(int *)plVar14[4] * 8) + 0x40)),
                        (Aig_Obj_t *)
                        ((ulong)(*(uint *)((long)plVar14 + 0x14) >> 0xb & 1) ^
                        *(ulong *)(*(long *)(lVar3 + (long)((int *)plVar14[4])[1] * 8) + 0x40)));
      plVar14[8] = (long)pAVar10;
      if (((ulong)plVar14 & 1) != 0) {
        pcVar7 = "!Abc_ObjIsComplement(pNode)";
LAB_002462cf:
        __assert_fail(pcVar7,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                      ,399,"int Abc_AigNodeIsChoice(Abc_Obj_t *)");
      }
      if (*(int *)*plVar14 != 3) {
        pcVar7 = "Abc_NtkIsStrash(pNode->pNtk)";
        goto LAB_002462cf;
      }
      if ((plVar14[7] != 0) && (0 < *(int *)((long)plVar14 + 0x2c))) {
        plVar4 = (long *)plVar14[7];
        while (plVar11 = plVar4, plVar11 != (long *)0x0) {
          if (p->pEquivs == (Aig_Obj_t **)0x0) {
            __assert_fail("p->pEquivs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                          ,0x149,"void Aig_ObjSetEquiv(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
          }
          p->pEquivs[*(int *)(plVar14[8] + 0x24)] = (Aig_Obj_t *)plVar11[8];
          plVar14 = plVar11;
          plVar4 = (long *)plVar11[7];
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < pVVar6->nSize);
  }
  if (pVVar6->pArray != (void **)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (void **)0x0;
  }
  if (pVVar6 != (Vec_Ptr_t *)0x0) {
    free(pVVar6);
  }
  pVVar6 = pNtk->vCos;
  if (0 < pVVar6->nSize) {
    lVar13 = 0;
    do {
      plVar14 = (long *)pVVar6->pArray[lVar13];
      Aig_ObjCreateCo(p,(Aig_Obj_t *)
                        ((ulong)(*(uint *)((long)plVar14 + 0x14) >> 10 & 1) ^
                        *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar14 + 0x20) + 8) +
                                            (long)*(int *)plVar14[4] * 8) + 0x40)));
      lVar13 = lVar13 + 1;
      pVVar6 = pNtk->vCos;
    } while (lVar13 < pVVar6->nSize);
  }
  Aig_ManSetRegNum(p,0);
  pAVar12 = p;
  iVar5 = Aig_ManCheck(p);
  if (iVar5 == 0) {
    Abc_Print((int)pAVar12,"Abc_NtkToDar: AIG check has failed.\n");
    Aig_ManStop(p);
    p = (Aig_Man_t *)0x0;
  }
  return p;
}

Assistant:

Aig_Man_t * Abc_NtkToDarChoices( Abc_Ntk_t * pNtk )
{
    Aig_Man_t * pMan;
    Abc_Obj_t * pObj, * pPrev, * pFanin;
    Vec_Ptr_t * vNodes;
    int i;
    vNodes = Abc_AigDfs( pNtk, 0, 0 );
    // create the manager
    pMan = Aig_ManStart( Abc_NtkNodeNum(pNtk) + 100 );
    pMan->nConstrs = pNtk->nConstrs;
    pMan->nBarBufs = pNtk->nBarBufs;
    pMan->pName = Extra_UtilStrsav( pNtk->pName );
    pMan->pSpec = Extra_UtilStrsav( pNtk->pSpec );
    if ( Abc_NtkGetChoiceNum(pNtk) )
    {
        pMan->pEquivs = ABC_ALLOC( Aig_Obj_t *, Abc_NtkObjNum(pNtk) );
        memset( pMan->pEquivs, 0, sizeof(Aig_Obj_t *) * Abc_NtkObjNum(pNtk) );
    }
    // transfer the pointers to the basic nodes
    Abc_AigConst1(pNtk)->pCopy = (Abc_Obj_t *)Aig_ManConst1(pMan);
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)Aig_ObjCreateCi(pMan);
    // perform the conversion of the internal nodes (assumes DFS ordering)
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        pObj->pCopy = (Abc_Obj_t *)Aig_And( pMan, (Aig_Obj_t *)Abc_ObjChild0Copy(pObj), (Aig_Obj_t *)Abc_ObjChild1Copy(pObj) );
//        Abc_Print( 1, "%d->%d ", pObj->Id, ((Aig_Obj_t *)pObj->pCopy)->Id );
        if ( Abc_AigNodeIsChoice( pObj ) )
        {
            for ( pPrev = pObj, pFanin = (Abc_Obj_t *)pObj->pData; pFanin; pPrev = pFanin, pFanin = (Abc_Obj_t *)pFanin->pData )
                Aig_ObjSetEquiv( pMan, (Aig_Obj_t *)pPrev->pCopy, (Aig_Obj_t *)pFanin->pCopy );
//            Aig_ManCreateChoice( pIfMan, (Aig_Obj_t *)pNode->pCopy );
        }
    }
    Vec_PtrFree( vNodes );
    // create the POs
    Abc_NtkForEachCo( pNtk, pObj, i )
        Aig_ObjCreateCo( pMan, (Aig_Obj_t *)Abc_ObjChild0Copy(pObj) );
    // complement the 1-valued registers
    Aig_ManSetRegNum( pMan, 0 );
    if ( !Aig_ManCheck( pMan ) )
    {
        Abc_Print( 1, "Abc_NtkToDar: AIG check has failed.\n" );
        Aig_ManStop( pMan );
        return NULL;
    }
    return pMan;
}